

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,ExpressionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  ExpressionKind EVar1;
  ExpressionSyntax *pEVar2;
  TimingControl *timing;
  Type *this;
  bool bVar3;
  int iVar4;
  SubroutineKind SVar5;
  undefined4 extraout_var;
  SourceLocation SVar6;
  Diagnostic *this_01;
  char *func;
  UnaryExpression *unary;
  string_view arg;
  SourceRange local_40;
  CallExpression *this_00;
  
  if (((stmtCtx->flags).m_bits & 8) == 0) {
LAB_0027a4c1:
    pEVar2 = (syntax->expr).ptr;
    if (pEVar2 != (ExpressionSyntax *)0x0) {
      iVar4 = Expression::bind((int)pEVar2,(sockaddr *)context,0x420);
      this_00 = (CallExpression *)CONCAT44(extraout_var,iVar4);
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      SVar6 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                        (&compilation->super_BumpAllocator,(Expression *)this_00,&local_40);
      bVar3 = Expression::bad((Expression *)this_00);
      if (!bVar3) {
        EVar1 = (this_00->super_Expression).kind;
        if ((int)EVar1 < 0x15) {
          if (EVar1 == UnaryOp) {
            if (*(int *)&(this_00->subroutine).
                         super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         .
                         super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         ._M_u - 10U < 4) {
              return (Statement *)SVar6;
            }
          }
          else if (EVar1 == Assignment) {
            timing = *(TimingControl **)
                      ((long)&(this_00->subroutine).
                              super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                      + 8);
            if (timing == (TimingControl *)0x0) {
              return (Statement *)SVar6;
            }
            Statement::StatementContext::observeTiming(stmtCtx,timing);
            return (Statement *)SVar6;
          }
        }
        else {
          if (EVar1 == NewClass) {
            return (Statement *)SVar6;
          }
          if (EVar1 == Call) {
            SVar5 = CallExpression::getSubroutineKind(this_00);
            this = (this_00->super_Expression).type.ptr;
            if (this != (Type *)0x0) {
              if (this->canonical == (Type *)0x0) {
                Type::resolveCanonical(this);
              }
              if (SVar5 != Function) {
                return (Statement *)SVar6;
              }
              if ((this->canonical->super_Symbol).kind == VoidType) {
                return (Statement *)SVar6;
              }
              this_01 = ASTContext::addDiag(context,(DiagCode)0x510008,
                                            (this_00->super_Expression).sourceRange);
              if ((this_00->super_Expression).kind == Call) {
                arg = CallExpression::getSubroutineName(this_00);
                Diagnostic::operator<<(this_01,arg);
                return (Statement *)SVar6;
              }
              assert::assertFailed
                        ("T::isKind(kind)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Expression.h"
                         ,299,
                         "const T &slang::ast::Expression::as() const [T = slang::ast::CallExpression]"
                        );
            }
            func = 
            "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
            ;
            goto LAB_0027a621;
          }
        }
        ASTContext::addDiag(context,(DiagCode)0x140008,(this_00->super_Expression).sourceRange);
      }
      local_40.startLoc = SVar6;
      SVar6 = (SourceLocation)
              BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                        (&compilation->super_BumpAllocator,(Statement **)&local_40);
      return (Statement *)SVar6;
    }
  }
  else {
    pEVar2 = (syntax->expr).ptr;
    if (pEVar2 != (ExpressionSyntax *)0x0) {
      slang::syntax::BinaryExpressionSyntax::isKind((pEVar2->super_SyntaxNode).kind);
      goto LAB_0027a4c1;
    }
  }
  func = 
  "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
  ;
LAB_0027a621:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const ExpressionStatementSyntax& syntax,
                                           const ASTContext& context, StatementContext& stmtCtx) {
    bitmask<ASTFlags> extraFlags = ASTFlags::AssignmentAllowed | ASTFlags::TopLevelStatement;
    if (stmtCtx.flags.has(StatementFlags::InForLoop) &&
        BinaryExpressionSyntax::isKind(syntax.expr->kind) &&
        !compilation.getOptions().strictDriverChecking) {
        extraFlags |= ASTFlags::UnrollableForLoop;
    }

    auto& expr = Expression::bind(*syntax.expr, context, extraFlags);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    // Only a subset of expressions are allowed as statements.
    bool ok;
    switch (expr.kind) {
        case ExpressionKind::Call: {
            auto subKind = expr.as<CallExpression>().getSubroutineKind();
            if (!expr.type->isVoid() && subKind == SubroutineKind::Function) {
                context.addDiag(diag::UnusedResult, expr.sourceRange)
                    << expr.as<CallExpression>().getSubroutineName();
            }
            ok = true;
            break;
        }
        case ExpressionKind::Assignment:
            if (auto timing = expr.as<AssignmentExpression>().timingControl)
                stmtCtx.observeTiming(*timing);

            ok = true;
            break;
        case ExpressionKind::NewClass:
            ok = true;
            break;
        case ExpressionKind::UnaryOp: {
            auto& unary = expr.as<UnaryExpression>();
            ok = unary.op == UnaryOperator::Preincrement ||
                 unary.op == UnaryOperator::Predecrement ||
                 unary.op == UnaryOperator::Postincrement ||
                 unary.op == UnaryOperator::Postdecrement;
            break;
        }
        default:
            ok = false;
            break;
    }

    if (!ok) {
        context.addDiag(diag::ExprNotStatement, expr.sourceRange);
        return badStmt(compilation, result);
    }

    return *result;
}